

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::pushFunctionScope
          (CheckerVisitor *this,VarScope *functionScope,FunctionDecl *decl)

{
  mapped_type *ppFVar1;
  FunctionInfo *pFVar2;
  FunctionDecl *local_30;
  
  local_30 = decl;
  ppFVar1 = std::__detail::
            _Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->functionInfoMap,&local_30);
  if (*ppFVar1 == (mapped_type)0x0) {
    pFVar2 = makeFunctionInfo(this,local_30,this->currentScope->owner);
    ppFVar1 = std::__detail::
              _Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<const_SQCompilation::FunctionDecl_*,_std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>,_std::allocator<std::pair<const_SQCompilation::FunctionDecl_*const,_SQCompilation::FunctionInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_SQCompilation::FunctionDecl_*>,_std::hash<const_SQCompilation::FunctionDecl_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->functionInfoMap,&local_30);
    *ppFVar1 = pFVar2;
  }
  this->currentScope = functionScope;
  return;
}

Assistant:

void CheckerVisitor::pushFunctionScope(VarScope *functionScope, const FunctionDecl *decl) {

  FunctionInfo *info = functionInfoMap[decl];

  if (!info) {
    info = makeFunctionInfo(decl, currentScope->owner);
    functionInfoMap[decl] = info;
  }

  currentScope = functionScope;
}